

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::add
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this,CJoystick *item)

{
  CJoystick *in_RSI;
  CJoystick *in_RDI;
  
  incsize((array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *)in_RSI);
  size((array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *)in_RDI);
  set_size((array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *)in_RSI,
           (int)((ulong)in_RDI >> 0x20));
  CInput::CJoystick::operator=(in_RSI,in_RDI);
  return *(int *)((long)&in_RDI->m_pInput + 4) + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}